

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<double>::AddKel
          (TPZFrontSym<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long row;
  long col;
  long lVar8;
  
  lVar1 = destinationindex->fNElements;
  row = 0;
  lVar6 = 0;
  if (0 < lVar1) {
    lVar6 = lVar1;
  }
  for (; row != lVar6; row = row + 1) {
    iVar3 = Local(this,destinationindex->fStore[row]);
    lVar8 = (long)iVar3;
    for (col = row; lVar1 != col; col = col + 1) {
      iVar3 = Local(this,destinationindex->fStore[col]);
      lVar7 = (long)iVar3;
      pdVar4 = TPZFMatrix<double>::operator()(elmat,row,col);
      lVar5 = lVar7;
      if (lVar7 < lVar8) {
        lVar5 = lVar8;
      }
      if (lVar8 < lVar7) {
        lVar7 = lVar8;
      }
      lVar5 = ((lVar5 + 1) * lVar5) / 2;
      pdVar2 = (this->super_TPZFront<double>).fData.fStore;
      pdVar2[lVar5 + lVar7] = *pdVar4 + pdVar2[lVar5 + lVar7];
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}